

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListTest_splice_range_Test::TestBody(IntrusiveListTest_splice_range_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  vector<int,_std::allocator<int>_> local_358;
  allocator<int> local_339;
  int local_338 [8];
  iterator local_318;
  size_type local_310;
  vector<int,_std::allocator<int>_> local_308;
  iterator local_2f0;
  iterator local_2e0;
  iterator local_2d0;
  iterator local_2c0;
  allocator<int> local_2ad;
  int local_2ac;
  iterator local_2a8;
  size_type local_2a0;
  vector<int,_std::allocator<int>_> local_298;
  undefined1 local_280 [8];
  TestObjectList list4;
  vector<int,_std::allocator<int>_> local_250;
  allocator<int> local_235;
  int local_234 [7];
  iterator local_218;
  size_type local_210;
  vector<int,_std::allocator<int>_> local_208;
  iterator local_1f0;
  iterator local_1e0;
  iterator local_1d0;
  iterator local_1c0;
  allocator<int> local_1ad;
  int local_1ac [3];
  iterator local_1a0;
  size_type local_198;
  vector<int,_std::allocator<int>_> local_190;
  undefined1 local_178 [8];
  TestObjectList list3;
  vector<int,_std::allocator<int>_> local_148;
  allocator<int> local_12d;
  int local_12c [5];
  iterator local_118;
  size_type local_110;
  vector<int,_std::allocator<int>_> local_108;
  iterator local_f0;
  iterator local_e0;
  iterator local_d0;
  iterator local_c0;
  allocator<int> local_ad;
  int local_ac [3];
  iterator local_a0;
  size_type local_98;
  vector<int,_std::allocator<int>_> local_90;
  undefined1 local_78 [8];
  TestObjectList list2;
  vector<int,_std::allocator<int>_> local_40;
  undefined1 local_28 [8];
  TestObjectList list1;
  IntrusiveListTest_splice_range_Test *this_local;
  
  list2.size_._4_4_ = 1;
  list1.size_ = (size_t)this;
  std::allocator<int>::allocator((allocator<int> *)((long)&list2.size_ + 3));
  __l_07._M_len = 3;
  __l_07._M_array = (iterator)((long)&list2.size_ + 4);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_40,__l_07,(allocator_type *)((long)&list2.size_ + 3));
  anon_unknown.dwarf_4ebdc::IntrusiveListTest::NewList
            ((TestObjectList *)local_28,&this->super_IntrusiveListTest,&local_40);
  std::vector<int,_std::allocator<int>_>::~vector(&local_40);
  std::allocator<int>::~allocator((allocator<int> *)((long)&list2.size_ + 3));
  local_ac[0] = 100;
  local_ac[1] = 200;
  local_ac[2] = 300;
  local_a0 = local_ac;
  local_98 = 3;
  std::allocator<int>::allocator(&local_ad);
  __l_06._M_len = local_98;
  __l_06._M_array = local_a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_90,__l_06,&local_ad);
  anon_unknown.dwarf_4ebdc::IntrusiveListTest::NewList
            ((TestObjectList *)local_78,&this->super_IntrusiveListTest,&local_90);
  std::vector<int,_std::allocator<int>_>::~vector(&local_90);
  std::allocator<int>::~allocator(&local_ad);
  local_c0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_d0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_78);
  local_f0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_78);
  local_e0 = std::prev<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                       (local_f0,1);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,(int)local_c0.list_,
             (__off64_t *)local_c0.node_,(int)local_78,(__off64_t *)local_d0.list_,
             (size_t)local_d0.node_,(uint)local_e0.list_);
  local_12c[0] = 100;
  local_12c[1] = 200;
  local_12c[2] = 1;
  local_12c[3] = 2;
  local_12c[4] = 3;
  local_118 = local_12c;
  local_110 = 5;
  std::allocator<int>::allocator(&local_12d);
  __l_05._M_len = local_110;
  __l_05._M_array = local_118;
  std::vector<int,_std::allocator<int>_>::vector(&local_108,__l_05,&local_12d);
  anon_unknown.dwarf_4ebdc::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_108);
  std::vector<int,_std::allocator<int>_>::~vector(&local_108);
  std::allocator<int>::~allocator(&local_12d);
  list3.size_._4_4_ = 300;
  std::allocator<int>::allocator((allocator<int> *)((long)&list3.size_ + 3));
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)((long)&list3.size_ + 4);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_148,__l_04,(allocator_type *)((long)&list3.size_ + 3));
  anon_unknown.dwarf_4ebdc::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_78,&local_148);
  std::vector<int,_std::allocator<int>_>::~vector(&local_148);
  std::allocator<int>::~allocator((allocator<int> *)((long)&list3.size_ + 3));
  local_1ac[0] = 500;
  local_1ac[1] = 600;
  local_1ac[2] = 700;
  local_1a0 = local_1ac;
  local_198 = 3;
  std::allocator<int>::allocator(&local_1ad);
  __l_03._M_len = local_198;
  __l_03._M_array = local_1a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_190,__l_03,&local_1ad);
  anon_unknown.dwarf_4ebdc::IntrusiveListTest::NewList
            ((TestObjectList *)local_178,&this->super_IntrusiveListTest,&local_190);
  std::vector<int,_std::allocator<int>_>::~vector(&local_190);
  std::allocator<int>::~allocator(&local_1ad);
  local_1c0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_1e0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_178);
  local_1d0 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                        (local_1e0,1);
  local_1f0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_178);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,(int)local_1c0.list_,
             (__off64_t *)local_1c0.node_,(int)local_178,(__off64_t *)local_1d0.list_,
             (size_t)local_1d0.node_,(uint)local_1f0.list_);
  local_234[0] = 100;
  local_234[1] = 200;
  local_234[2] = 1;
  local_234[3] = 2;
  local_234[4] = 3;
  local_234[5] = 600;
  local_234[6] = 700;
  local_218 = local_234;
  local_210 = 7;
  std::allocator<int>::allocator(&local_235);
  __l_02._M_len = local_210;
  __l_02._M_array = local_218;
  std::vector<int,_std::allocator<int>_>::vector(&local_208,__l_02,&local_235);
  anon_unknown.dwarf_4ebdc::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_208);
  std::vector<int,_std::allocator<int>_>::~vector(&local_208);
  std::allocator<int>::~allocator(&local_235);
  list4.size_._4_4_ = 500;
  std::allocator<int>::allocator((allocator<int> *)((long)&list4.size_ + 3));
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)((long)&list4.size_ + 4);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_250,__l_01,(allocator_type *)((long)&list4.size_ + 3));
  anon_unknown.dwarf_4ebdc::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_178,&local_250);
  std::vector<int,_std::allocator<int>_>::~vector(&local_250);
  std::allocator<int>::~allocator((allocator<int> *)((long)&list4.size_ + 3));
  local_2ac = 400;
  local_2a8 = &local_2ac;
  local_2a0 = 1;
  std::allocator<int>::allocator(&local_2ad);
  __l_00._M_len = local_2a0;
  __l_00._M_array = local_2a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_298,__l_00,&local_2ad);
  anon_unknown.dwarf_4ebdc::IntrusiveListTest::NewList
            ((TestObjectList *)local_280,&this->super_IntrusiveListTest,&local_298);
  std::vector<int,_std::allocator<int>_>::~vector(&local_298);
  std::allocator<int>::~allocator(&local_2ad);
  local_2d0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_2c0 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                        (local_2d0,4);
  local_2e0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_280);
  local_2f0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_280);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,(int)local_2c0.list_,
             (__off64_t *)local_2c0.node_,(int)local_280,(__off64_t *)local_2e0.list_,
             (size_t)local_2e0.node_,(uint)local_2f0.list_);
  local_338[0] = 100;
  local_338[1] = 200;
  local_338[2] = 1;
  local_338[3] = 2;
  local_338[4] = 400;
  local_338[5] = 3;
  local_338[6] = 600;
  local_338[7] = 700;
  local_318 = local_338;
  local_310 = 8;
  std::allocator<int>::allocator(&local_339);
  __l._M_len = local_310;
  __l._M_array = local_318;
  std::vector<int,_std::allocator<int>_>::vector(&local_308,__l,&local_339);
  anon_unknown.dwarf_4ebdc::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_308);
  std::vector<int,_std::allocator<int>_>::~vector(&local_308);
  std::allocator<int>::~allocator(&local_339);
  memset(&local_358,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(&local_358);
  anon_unknown.dwarf_4ebdc::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_280,&local_358);
  std::vector<int,_std::allocator<int>_>::~vector(&local_358);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_280);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_178);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_78);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, splice_range) {
  TestObjectList list1 = NewList({1, 2, 3});

  // Splice at beginning.
  TestObjectList list2 = NewList({100, 200, 300});
  list1.splice(list1.begin(), list2, list2.begin(), std::prev(list2.end()));
  AssertListEq(list1, {100, 200, 1, 2, 3});
  AssertListEq(list2, {300});

  // Splice at end.
  TestObjectList list3 = NewList({500, 600, 700});
  list1.splice(list1.end(), list3, std::next(list3.begin()), list3.end());
  AssertListEq(list1, {100, 200, 1, 2, 3, 600, 700});
  AssertListEq(list3, {500});

  // Splice in the middle.
  TestObjectList list4 = NewList({400});
  list1.splice(std::next(list1.begin(), 4), list4, list4.begin(), list4.end());
  AssertListEq(list1, {100, 200, 1, 2, 400, 3, 600, 700});
  AssertListEq(list4, {});
}